

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O0

int writeOffset(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  int iVar1;
  undefined8 local_30;
  curl_off_t offinfo;
  _Bool valid;
  _Bool use_json_local;
  per_transfer *ppStack_20;
  CURLcode per_result_local;
  per_transfer *per_local;
  writeoutvar *wovar_local;
  FILE *stream_local;
  
  offinfo._2_1_ = 0;
  local_30 = 0;
  offinfo._3_1_ = use_json;
  offinfo._4_4_ = per_result;
  ppStack_20 = per;
  per_local = (per_transfer *)wovar;
  wovar_local = (writeoutvar *)stream;
  if ((wovar->ci != CURLINFO_NONE) &&
     (iVar1 = curl_easy_getinfo(per->curl,wovar->ci,&local_30), iVar1 == 0)) {
    offinfo._2_1_ = 1;
  }
  if ((offinfo._2_1_ & 1) == 0) {
    if ((offinfo._3_1_ & 1) != 0) {
      curl_mfprintf(wovar_local,"\"%s\":null",per_local->next);
    }
  }
  else {
    if ((offinfo._3_1_ & 1) != 0) {
      curl_mfprintf(wovar_local,"\"%s\":",per_local->next);
    }
    curl_mfprintf(wovar_local,"%ld",local_30);
  }
  return 1;
}

Assistant:

static int writeOffset(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  curl_off_t offinfo = 0;

  (void)per;
  (void)per_result;
  DEBUGASSERT(wovar->writefunc == writeOffset);

  if(wovar->ci) {
    if(!curl_easy_getinfo(per->curl, wovar->ci, &offinfo))
      valid = true;
  }
  else {
    DEBUGASSERT(0);
  }

  if(valid) {
    if(use_json)
      fprintf(stream, "\"%s\":", wovar->name);

    fprintf(stream, "%" CURL_FORMAT_CURL_OFF_T, offinfo);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}